

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::StrpTimeFunction::Bind
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  bool bVar1;
  LogicalTypeId LVar2;
  uint uVar3;
  pointer pEVar4;
  undefined8 uVar5;
  LogicalType *this;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  InvalidInputException *this_00;
  type expr;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  string error_1;
  Value *child;
  const_iterator __end5;
  const_iterator __begin5;
  vector<duckdb::Value,_true> *__range5;
  bool has_nanos;
  bool has_offset;
  vector<duckdb::StrpTimeFormat,_true> formats;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  format_strings;
  vector<duckdb::Value,_true> *children;
  string error;
  StrpTimeFormat format;
  string format_string;
  Value format_value;
  LogicalType *in_stack_fffffffffffffad8;
  Value *in_stack_fffffffffffffae0;
  allocator *paVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae8;
  vector<duckdb::StrpTimeFormat,_std::allocator<duckdb::StrpTimeFormat>_> *in_stack_fffffffffffffaf0
  ;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffaf8;
  StrTimeSpecifier s;
  StrTimeFormat *in_stack_fffffffffffffb00;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *this_01;
  undefined4 in_stack_fffffffffffffb08;
  undefined1 in_stack_fffffffffffffb0c;
  undefined1 in_stack_fffffffffffffb0d;
  bool bVar8;
  undefined1 in_stack_fffffffffffffb0e;
  undefined1 in_stack_fffffffffffffb0f;
  Value *in_stack_fffffffffffffb20;
  LogicalType *in_stack_fffffffffffffb28;
  string *in_stack_fffffffffffffb30;
  string *in_stack_fffffffffffffb38;
  string *in_stack_fffffffffffffb40;
  string *psVar9;
  Expression *in_stack_fffffffffffffb48;
  InvalidInputException *in_stack_fffffffffffffb50;
  Value *in_stack_fffffffffffffb78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  string *in_stack_fffffffffffffbb0;
  undefined7 in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbbf;
  Expression *in_stack_fffffffffffffbc0;
  undefined7 in_stack_fffffffffffffbc8;
  undefined1 in_stack_fffffffffffffbcf;
  allocator local_3e9;
  string local_3e8 [40];
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> local_3c0;
  undefined1 local_389;
  string local_388 [32];
  string local_368 [39];
  allocator local_341;
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  reference local_2e0;
  Value *local_2d8;
  __normal_iterator<const_duckdb::Value_*,_std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>_>
  local_2d0;
  vector<duckdb::Value,_true> *local_2c8;
  byte local_2ba;
  byte local_2b9;
  undefined1 local_282;
  undefined1 local_281 [33];
  vector<duckdb::Value,_true> *local_260;
  undefined1 local_1e9;
  string local_1e8 [32];
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [32];
  string local_180 [32];
  StrTimeFormat *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  string local_128 [112];
  string local_b8;
  Value local_98;
  undefined1 local_52;
  allocator local_51;
  string local_50 [80];
  
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffae0,(size_type)in_stack_fffffffffffffad8);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffae0);
  uVar3 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[6])();
  if ((uVar3 & 1) != 0) {
    uVar5 = __cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException
              ((ParameterNotResolvedException *)in_stack_fffffffffffffb20);
    __cxa_throw(uVar5,&ParameterNotResolvedException::typeinfo,
                ParameterNotResolvedException::~ParameterNotResolvedException);
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffae0,(size_type)in_stack_fffffffffffffad8);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffae0);
  uVar3 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0xf])();
  if ((uVar3 & 1) == 0) {
    local_52 = 1;
    uVar5 = __cxa_allocate_exception(0x10);
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffae0,(size_type)in_stack_fffffffffffffad8);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffae0);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_50,"strptime format must be a constant",&local_51);
    InvalidInputException::InvalidInputException<>
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
    local_52 = 0;
    __cxa_throw(uVar5,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException
               );
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffae0,(size_type)in_stack_fffffffffffffad8);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffae0);
  ExpressionExecutor::EvaluateScalar
            ((ClientContext *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
             in_stack_fffffffffffffbc0,(bool)in_stack_fffffffffffffbbf);
  ::std::__cxx11::string::string((string *)&local_b8);
  StrpTimeFormat::StrpTimeFormat((StrpTimeFormat *)in_stack_fffffffffffffae0);
  bVar1 = Value::IsNull(&local_98);
  if (bVar1) {
    make_uniq<duckdb::StrpTimeBindData,duckdb::StrpTimeFormat&,std::__cxx11::string&>
              ((StrpTimeFormat *)
               CONCAT17(in_stack_fffffffffffffb0f,
                        CONCAT16(in_stack_fffffffffffffb0e,
                                 CONCAT15(in_stack_fffffffffffffb0d,
                                          CONCAT14(in_stack_fffffffffffffb0c,
                                                   in_stack_fffffffffffffb08)))),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb00);
    unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
    unique_ptr<duckdb::StrpTimeBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               in_stack_fffffffffffffae0,
               (unique_ptr<duckdb::StrpTimeBindData,_std::default_delete<duckdb::StrpTimeBindData>_>
                *)in_stack_fffffffffffffad8);
    unique_ptr<duckdb::StrpTimeBindData,_std::default_delete<duckdb::StrpTimeBindData>,_true>::
    ~unique_ptr((unique_ptr<duckdb::StrpTimeBindData,_std::default_delete<duckdb::StrpTimeBindData>,_true>
                 *)0x11f0c73);
  }
  else {
    this = Value::type(&local_98);
    LVar2 = LogicalType::id(this);
    if (LVar2 == VARCHAR) {
      Value::ToString_abi_cxx11_(in_stack_fffffffffffffb78);
      psVar9 = &local_b8;
      params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xfffffffffffffea0;
      ::std::__cxx11::string::operator=((string *)psVar9,(string *)params);
      ::std::__cxx11::string::~string((string *)params);
      ::std::__cxx11::string::operator=(local_128,(string *)psVar9);
      StrTimeFormat::ParseFormatSpecifier(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      uVar6 = ::std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        local_1e9 = 1;
        uVar5 = __cxa_allocate_exception(0x10);
        params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                 *)in_stack_fffffffffffffae0,(size_type)in_stack_fffffffffffffad8);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffae0);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_1a0,"Failed to parse format specifier %s: %s",&local_1a1);
        ::std::__cxx11::string::string(local_1c8,(string *)&local_b8);
        ::std::__cxx11::string::string(local_1e8,local_180);
        InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
                  ((InvalidInputException *)this,
                   (Expression *)CONCAT17(LVar2,in_stack_fffffffffffffbb8),psVar9,params,params_1);
        local_1e9 = 0;
        __cxa_throw(uVar5,&InvalidInputException::typeinfo,
                    InvalidInputException::~InvalidInputException);
      }
      bVar1 = StrTimeFormat::HasFormatSpecifier
                        (in_stack_fffffffffffffb00,
                         (StrTimeSpecifier)((ulong)in_stack_fffffffffffffaf8 >> 0x38));
      s = (StrTimeSpecifier)((ulong)in_stack_fffffffffffffaf8 >> 0x38);
      if (bVar1) {
        LogicalType::LogicalType((LogicalType *)in_stack_fffffffffffffb00,s);
        LogicalType::operator=(&in_stack_fffffffffffffae0->type_,in_stack_fffffffffffffad8);
        LogicalType::~LogicalType((LogicalType *)0x11f0faf);
      }
      else {
        bVar1 = StrTimeFormat::HasFormatSpecifier(in_stack_fffffffffffffb00,s);
        if (bVar1) {
          LogicalType::LogicalType
                    ((LogicalType *)in_stack_fffffffffffffb00,
                     (LogicalTypeId)((ulong)in_stack_fffffffffffffaf8 >> 0x38));
          LogicalType::operator=(&in_stack_fffffffffffffae0->type_,in_stack_fffffffffffffad8);
          LogicalType::~LogicalType((LogicalType *)0x11f103d);
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffae0,(char *)in_stack_fffffffffffffad8);
          if (bVar1) {
            ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
            operator=((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                       *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
          }
          else {
            ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
            operator=((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                       *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
          }
        }
      }
      make_uniq<duckdb::StrpTimeBindData,duckdb::StrpTimeFormat&,std::__cxx11::string&>
                ((StrpTimeFormat *)
                 CONCAT17(in_stack_fffffffffffffb0f,
                          CONCAT16(in_stack_fffffffffffffb0e,
                                   CONCAT15(in_stack_fffffffffffffb0d,
                                            CONCAT14(in_stack_fffffffffffffb0c,
                                                     in_stack_fffffffffffffb08)))),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb00);
      unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
      unique_ptr<duckdb::StrpTimeBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
                ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)in_stack_fffffffffffffae0,
                 (unique_ptr<duckdb::StrpTimeBindData,_std::default_delete<duckdb::StrpTimeBindData>_>
                  *)in_stack_fffffffffffffad8);
      unique_ptr<duckdb::StrpTimeBindData,_std::default_delete<duckdb::StrpTimeBindData>,_true>::
      ~unique_ptr((unique_ptr<duckdb::StrpTimeBindData,_std::default_delete<duckdb::StrpTimeBindData>,_true>
                   *)0x11f10e8);
      ::std::__cxx11::string::~string(local_180);
    }
    else {
      Value::type(&local_98);
      LogicalType::LogicalType
                ((LogicalType *)in_stack_fffffffffffffb00,
                 (LogicalTypeId)((ulong)in_stack_fffffffffffffaf8 >> 0x38));
      LogicalType::LIST(in_stack_fffffffffffffb28);
      bVar1 = LogicalType::operator==
                        ((LogicalType *)in_stack_fffffffffffffae8,&in_stack_fffffffffffffae0->type_)
      ;
      LogicalType::~LogicalType((LogicalType *)0x11f1184);
      LogicalType::~LogicalType((LogicalType *)0x11f1191);
      if (!bVar1) {
        uVar5 = __cxa_allocate_exception(0x10);
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)in_stack_fffffffffffffae0,(size_type)in_stack_fffffffffffffad8);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffae0);
        paVar7 = &local_3e9;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_3e8,"strptime format must be a string",paVar7);
        InvalidInputException::InvalidInputException<>
                  (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
        __cxa_throw(uVar5,&InvalidInputException::typeinfo,
                    InvalidInputException::~InvalidInputException);
      }
      local_260 = ListValue::GetChildren(in_stack_fffffffffffffb20);
      bVar1 = ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::empty
                        ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                         in_stack_fffffffffffffaf0);
      if (bVar1) {
        local_282 = 1;
        this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)in_stack_fffffffffffffae0,(size_type)in_stack_fffffffffffffad8);
        expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)in_stack_fffffffffffffae0);
        psVar9 = (string *)local_281;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)(local_281 + 1),"strptime format list must not be empty",
                   (allocator *)psVar9);
        InvalidInputException::InvalidInputException<>(this_00,expr,psVar9);
        local_282 = 0;
        __cxa_throw(this_00,&InvalidInputException::typeinfo,
                    InvalidInputException::~InvalidInputException);
      }
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)0x11f135a);
      vector<duckdb::StrpTimeFormat,_true>::vector
                ((vector<duckdb::StrpTimeFormat,_true> *)0x11f1367);
      local_2b9 = 0;
      local_2ba = 0;
      local_2c8 = local_260;
      local_2d0._M_current =
           (Value *)::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::begin
                              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                               in_stack_fffffffffffffad8);
      local_2d8 = (Value *)::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::end
                                     ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                                      in_stack_fffffffffffffad8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_duckdb::Value_*,_std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>_>
                                 *)in_stack_fffffffffffffae0,
                                (__normal_iterator<const_duckdb::Value_*,_std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>_>
                                 *)in_stack_fffffffffffffad8), bVar1) {
        local_2e0 = __gnu_cxx::
                    __normal_iterator<const_duckdb::Value_*,_std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>_>
                    ::operator*(&local_2d0);
        Value::ToString_abi_cxx11_(in_stack_fffffffffffffb78);
        in_stack_fffffffffffffb38 = &local_b8;
        in_stack_fffffffffffffb30 = local_300;
        ::std::__cxx11::string::operator=
                  ((string *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffb30);
        ::std::__cxx11::string::operator=(local_128,(string *)in_stack_fffffffffffffb38);
        StrTimeFormat::ParseFormatSpecifier(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
        uVar6 = ::std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          local_389 = 1;
          uVar5 = __cxa_allocate_exception(0x10);
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        *)in_stack_fffffffffffffae0,(size_type)in_stack_fffffffffffffad8);
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffffae0);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_340,"Failed to parse format specifier %s: %s",&local_341);
          ::std::__cxx11::string::string(local_368,(string *)&local_b8);
          ::std::__cxx11::string::string(local_388,local_320);
          InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
                    ((InvalidInputException *)this,
                     (Expression *)CONCAT17(LVar2,in_stack_fffffffffffffbb8),
                     in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
          local_389 = 0;
          __cxa_throw(uVar5,&InvalidInputException::typeinfo,
                      InvalidInputException::~InvalidInputException);
        }
        bVar1 = true;
        if ((local_2b9 & 1) == 0) {
          bVar1 = StrTimeFormat::HasFormatSpecifier
                            (in_stack_fffffffffffffb00,
                             (StrTimeSpecifier)((ulong)in_stack_fffffffffffffaf8 >> 0x38));
        }
        bVar8 = true;
        local_2b9 = bVar1;
        if ((local_2ba & 1) == 0) {
          bVar8 = StrTimeFormat::HasFormatSpecifier
                            (in_stack_fffffffffffffb00,
                             (StrTimeSpecifier)((ulong)in_stack_fffffffffffffaf8 >> 0x38));
        }
        local_2ba = bVar8;
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
        ::std::vector<duckdb::StrpTimeFormat,std::allocator<duckdb::StrpTimeFormat>>::
        emplace_back<duckdb::StrpTimeFormat&>
                  (in_stack_fffffffffffffaf0,(StrpTimeFormat *)in_stack_fffffffffffffae8);
        ::std::__cxx11::string::~string(local_320);
        __gnu_cxx::
        __normal_iterator<const_duckdb::Value_*,_std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>_>
        ::operator++(&local_2d0);
      }
      LVar2 = (LogicalTypeId)((ulong)in_stack_fffffffffffffaf8 >> 0x38);
      if ((local_2b9 & 1) == 0) {
        if ((local_2ba & 1) != 0) {
          LogicalType::LogicalType((LogicalType *)in_stack_fffffffffffffb00,LVar2);
          this_01 = &local_3c0;
          LogicalType::operator=(&in_stack_fffffffffffffae0->type_,in_stack_fffffffffffffad8);
          LogicalType::~LogicalType((LogicalType *)0x11f17b6);
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffae0,(char *)in_stack_fffffffffffffad8);
          if (bVar1) {
            ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
            operator=(this_01,in_stack_fffffffffffffaf8);
          }
          else {
            ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
            operator=(this_01,in_stack_fffffffffffffaf8);
          }
        }
      }
      else {
        LogicalType::LogicalType((LogicalType *)in_stack_fffffffffffffb00,LVar2);
        LogicalType::operator=(&in_stack_fffffffffffffae0->type_,in_stack_fffffffffffffad8);
        LogicalType::~LogicalType((LogicalType *)0x11f1764);
      }
      make_uniq<duckdb::StrpTimeBindData,duckdb::vector<duckdb::StrpTimeFormat,true>&,duckdb::vector<std::__cxx11::string,true>&>
                ((vector<duckdb::StrpTimeFormat,_true> *)in_stack_fffffffffffffb38,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)in_stack_fffffffffffffb30);
      unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
      unique_ptr<duckdb::StrpTimeBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
                ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)in_stack_fffffffffffffae0,
                 (unique_ptr<duckdb::StrpTimeBindData,_std::default_delete<duckdb::StrpTimeBindData>_>
                  *)in_stack_fffffffffffffad8);
      unique_ptr<duckdb::StrpTimeBindData,_std::default_delete<duckdb::StrpTimeBindData>,_true>::
      ~unique_ptr((unique_ptr<duckdb::StrpTimeBindData,_std::default_delete<duckdb::StrpTimeBindData>,_true>
                   *)0x11f185b);
      vector<duckdb::StrpTimeFormat,_true>::~vector
                ((vector<duckdb::StrpTimeFormat,_true> *)0x11f1873);
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 *)0x11f1880);
    }
  }
  StrpTimeFormat::~StrpTimeFormat((StrpTimeFormat *)0x11f19ce);
  ::std::__cxx11::string::~string((string *)&local_b8);
  Value::~Value(in_stack_fffffffffffffae0);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> Bind(ClientContext &context, ScalarFunction &bound_function,
	                                     vector<unique_ptr<Expression>> &arguments) {
		if (arguments[1]->HasParameter()) {
			throw ParameterNotResolvedException();
		}
		if (!arguments[1]->IsFoldable()) {
			throw InvalidInputException(*arguments[0], "strptime format must be a constant");
		}
		Value format_value = ExpressionExecutor::EvaluateScalar(context, *arguments[1]);
		string format_string;
		StrpTimeFormat format;
		if (format_value.IsNull()) {
			return make_uniq<StrpTimeBindData>(format, format_string);
		} else if (format_value.type().id() == LogicalTypeId::VARCHAR) {
			format_string = format_value.ToString();
			format.format_specifier = format_string;
			string error = StrTimeFormat::ParseFormatSpecifier(format_string, format);
			if (!error.empty()) {
				throw InvalidInputException(*arguments[0], "Failed to parse format specifier %s: %s", format_string,
				                            error);
			}
			if (format.HasFormatSpecifier(StrTimeSpecifier::UTC_OFFSET)) {
				bound_function.return_type = LogicalType::TIMESTAMP_TZ;
			} else if (format.HasFormatSpecifier(StrTimeSpecifier::NANOSECOND_PADDED)) {
				bound_function.return_type = LogicalType::TIMESTAMP_NS;
				if (bound_function.name == "strptime") {
					bound_function.function = Parse<timestamp_ns_t>;
				} else {
					bound_function.function = TryParse<timestamp_ns_t>;
				}
			}
			return make_uniq<StrpTimeBindData>(format, format_string);
		} else if (format_value.type() == LogicalType::LIST(LogicalType::VARCHAR)) {
			const auto &children = ListValue::GetChildren(format_value);
			if (children.empty()) {
				throw InvalidInputException(*arguments[0], "strptime format list must not be empty");
			}
			vector<string> format_strings;
			vector<StrpTimeFormat> formats;
			bool has_offset = false;
			bool has_nanos = false;

			for (const auto &child : children) {
				format_string = child.ToString();
				format.format_specifier = format_string;
				string error = StrTimeFormat::ParseFormatSpecifier(format_string, format);
				if (!error.empty()) {
					throw InvalidInputException(*arguments[0], "Failed to parse format specifier %s: %s", format_string,
					                            error);
				}
				has_offset = has_offset || format.HasFormatSpecifier(StrTimeSpecifier::UTC_OFFSET);
				has_nanos = has_nanos || format.HasFormatSpecifier(StrTimeSpecifier::NANOSECOND_PADDED);
				format_strings.emplace_back(format_string);
				formats.emplace_back(format);
			}

			if (has_offset) {
				// If any format has UTC offsets, then we have to produce TSTZ
				bound_function.return_type = LogicalType::TIMESTAMP_TZ;
			} else if (has_nanos) {
				// If any format has nanoseconds, then we have to produce TSNS
				// unless there is an offset, in which case we produce
				bound_function.return_type = LogicalType::TIMESTAMP_NS;
				if (bound_function.name == "strptime") {
					bound_function.function = Parse<timestamp_ns_t>;
				} else {
					bound_function.function = TryParse<timestamp_ns_t>;
				}
			}
			return make_uniq<StrpTimeBindData>(formats, format_strings);
		} else {
			throw InvalidInputException(*arguments[0], "strptime format must be a string");
		}
	}